

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

bool __thiscall soul::Value::operator==(Value *this,Value *other)

{
  bool bVar1;
  bool local_59;
  PackedData local_50;
  PackedData local_38;
  Value *local_20;
  Value *other_local;
  Value *this_local;
  
  local_20 = other;
  other_local = this;
  bVar1 = Type::isValid(&this->type);
  if (bVar1) {
    bVar1 = Type::isIdentical(&this->type,&local_20->type);
    local_59 = false;
    if (bVar1) {
      getData(&local_38,this);
      getData(&local_50,local_20);
      local_59 = PackedData::equals(&local_38,&local_50);
    }
    this_local._7_1_ = local_59;
  }
  else {
    bVar1 = Type::isValid(&local_20->type);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Value::operator== (const Value& other) const
{
    if (! type.isValid())
        return ! other.type.isValid();

    return type.isIdentical (other.type) && getData().equals (other.getData());
}